

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall helics::CommonCore::CommonCore(CommonCore *this)

{
  _Rb_tree_header *p_Var1;
  TimeoutMonitor *pTVar2;
  condition_variable *this_00;
  long lVar3;
  
  (this->super_Core)._vptr_Core = (_func_int **)&PTR__Core_004da390;
  BrokerBase::BrokerBase(&this->super_BrokerBase,false);
  (this->super_Core)._vptr_Core = (_func_int **)&PTR__CommonCore_004d9de0;
  (this->super_BrokerBase)._vptr_BrokerBase = (_func_int **)&PTR__CommonCore_004da170;
  (this->simTime).super___atomic_float<double>._M_fp = -98763.2;
  (this->keyFed).gid = -2010000000;
  (this->prevIdentifier)._M_dataplus._M_p = (pointer)&(this->prevIdentifier).field_2;
  (this->prevIdentifier)._M_string_length = 0;
  (this->prevIdentifier).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->routing_table)._M_t._M_impl.super__Rb_tree_header;
  (this->routing_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->routing_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->routing_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->routing_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  memset(&(this->routing_table)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0x88);
  (this->delayTransmitQueue).queueEmptyFlag._M_base._M_i = true;
  (this->knownExternalEndpoints)._M_h._M_buckets =
       &(this->knownExternalEndpoints)._M_h._M_single_bucket;
  (this->knownExternalEndpoints)._M_h._M_bucket_count = 1;
  (this->knownExternalEndpoints)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->knownExternalEndpoints)._M_h._M_element_count = 0;
  (this->knownExternalEndpoints)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->knownExternalEndpoints)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->knownExternalEndpoints)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->tags).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tags).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tags).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar2 = (TimeoutMonitor *)operator_new(0x40);
  (pTVar2->timeout).__r = 0;
  *(undefined8 *)&pTVar2->waitingForConnection = 0;
  (pTVar2->startWaiting).__d.__r = 0;
  (pTVar2->parentConnection).waitingForPingReply = false;
  (pTVar2->parentConnection).activeConnection = false;
  (pTVar2->parentConnection).disablePing = false;
  (pTVar2->parentConnection).field_0x3 = 0;
  (pTVar2->parentConnection).connection = 0;
  (pTVar2->parentConnection).lastPing.__d.__r = 0;
  *(undefined8 *)
   &(pTVar2->connections).
    super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_>._M_impl = 0;
  *(pointer *)
   ((long)&(pTVar2->connections).
           super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_> + 8)
       = (pointer)0x0;
  *(pointer *)
   ((long)&(pTVar2->connections).
           super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_> +
   0x10) = (pointer)0x0;
  (pTVar2->timeout).__r = 100000000;
  pTVar2->waitingForConnection = false;
  (pTVar2->startWaiting).__d.__r = 0;
  *(undefined4 *)((long)&(pTVar2->startWaiting).__d + 7) = 0;
  *(undefined8 *)&(pTVar2->parentConnection).connection = 0;
  *(undefined8 *)((long)&(pTVar2->parentConnection).lastPing + 4) = 0;
  *(undefined8 *)
   ((long)&(pTVar2->connections).
           super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_> + 4)
       = 0;
  *(undefined8 *)
   ((long)&(pTVar2->connections).
           super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_> + 0xc
   ) = 0;
  *(undefined4 *)
   ((long)&(pTVar2->connections).
           super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_> +
   0x14) = 0;
  (this->timeoutMon)._M_t.
  super___uniq_ptr_impl<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>._M_t.
  super__Tuple_impl<0UL,_helics::TimeoutMonitor_*,_std::default_delete<helics::TimeoutMonitor>_>.
  super__Head_base<0UL,_helics::TimeoutMonitor_*,_false>._M_head_impl = pTVar2;
  this->mGlobalFederationSize = 0;
  (this->delayInitCounter).super___atomic_base<short>._M_i = 0;
  this->filterTiming = false;
  (this->federates).m_obj.dataStorage.
  super__Vector_base<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>,_std::allocator<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->federates).m_obj.lookup._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->federates).m_obj.lookup._M_h._M_bucket_count = 0;
  (this->federates).m_obj.lookup._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->federates).m_obj.lookup._M_h._M_element_count = 0;
  *(undefined8 *)&(this->federates).m_obj.lookup._M_h._M_rehash_policy = 0;
  (this->federates).m_obj.dataStorage.
  super__Vector_base<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>,_std::allocator<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->federates).m_obj.dataStorage.
  super__Vector_base<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>,_std::allocator<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->federates).m_obj.lookup._M_h._M_buckets =
       &(this->federates).m_obj.lookup._M_h._M_single_bucket;
  (this->federates).m_obj.lookup._M_h._M_bucket_count = 1;
  (this->federates).m_obj.lookup._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->federates).m_obj.lookup._M_h._M_element_count = 0;
  (this->federates).m_obj.lookup._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->federates).m_obj.lookup._M_h._M_rehash_policy._M_next_resize = 0;
  (this->federates).m_obj.lookup._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->federates).m_mutex._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->federates).m_mutex._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->federates).m_mutex._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->federates).m_mutex._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->federates).m_mutex._M_impl._M_rwlock + 0x20) = 0;
  (this->federates).m_mutex._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->federates).m_mutex._M_impl._M_rwlock + 0x30) = 0;
  (this->loopFederates).dataStorage.csize = 0;
  (this->loopFederates).dataStorage.dataptr = (FedInfo **)0x0;
  (this->loopFederates).dataStorage.dataSlotsAvailable = 0;
  (this->loopFederates).dataStorage.dataSlotIndex = 0;
  (this->loopFederates).dataStorage.bsize = 0x20;
  (this->loopFederates).dataStorage.freeSlotsAvailable = 0;
  (this->loopFederates).dataStorage.freeIndex = 0;
  (this->loopFederates).dataStorage.freeblocks = (FedInfo **)0x0;
  (this->loopFederates).lookup1._M_h._M_buckets =
       &(this->loopFederates).lookup1._M_h._M_single_bucket;
  (this->loopFederates).lookup1._M_h._M_bucket_count = 1;
  (this->loopFederates).lookup1._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->loopFederates).lookup1._M_h._M_element_count = 0;
  (this->loopFederates).lookup1._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->loopFederates).names.dataSlotsAvailable = 0;
  (this->loopFederates).names.dataSlotIndex = 0;
  (this->loopFederates).names.csize = 0;
  (this->loopFederates).names.dataptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0;
  (this->loopFederates).lookup1._M_h._M_rehash_policy._M_next_resize = 0;
  (this->loopFederates).lookup1._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->loopFederates).names.bsize = 0x20;
  (this->loopFederates).names.freeSlotsAvailable = 0;
  (this->loopFederates).names.freeIndex = 0;
  (this->loopFederates).names.freeblocks =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0;
  (this->loopFederates).lookup2._M_h._M_buckets =
       &(this->loopFederates).lookup2._M_h._M_single_bucket;
  (this->loopFederates).lookup2._M_h._M_bucket_count = 1;
  (this->loopFederates).lookup2._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->loopFederates).lookup2._M_h._M_element_count = 0;
  (this->loopFederates).lookup2._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->loopFederates).lookup2._M_h._M_rehash_policy._M_next_resize = 0;
  (this->loopFederates).lookup2._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->messageCounter).super___atomic_base<int>._M_i = 0x36;
  memset(&this->handles,0,0x1d8);
  HandleManager::HandleManager(&(this->handles).m_obj);
  *(undefined8 *)((long)&(this->handles).m_mutex._M_impl._M_rwlock + 0x20) = 0;
  (this->handles).m_mutex._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->handles).m_mutex._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->handles).m_mutex._M_impl._M_rwlock + 0x18) = 0;
  (this->handles).m_mutex._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->handles).m_mutex._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->handles).m_mutex._M_impl._M_rwlock + 0x30) = 0;
  HandleManager::HandleManager(&this->loopHandles);
  (this->timeBlocks).
  super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->translatorFed = (TranslatorFederate *)0x0;
  (this->timeBlocks).
  super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->timeBlocks).
  super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->translatorThread)._M_i._M_thread = 0;
  (this->translatorFedID)._M_i.gid = -2010000000;
  p_Var1 = &(this->delayedTimingMessages)._M_t._M_impl.super__Rb_tree_header;
  (this->delayedTimingMessages)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->delayedTimingMessages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->delayedTimingMessages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->delayedTimingMessages)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->delayedTimingMessages)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->queryCounter).super___atomic_base<int>._M_i = 1;
  p_Var1 = &(this->activeQueries).promiseByInteger._M_t._M_impl.super__Rb_tree_header;
  (this->activeQueries).promiseByInteger._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->activeQueries).promiseByInteger._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->activeQueries).promiseByInteger._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->activeQueries).promiseByInteger._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->activeQueries).promiseByInteger._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->activeQueries).promiseByString._M_t._M_impl.super__Rb_tree_header;
  (this->activeQueries).promiseByString._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->activeQueries).promiseByString._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->activeQueries).promiseByString._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->activeQueries).promiseByString._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->activeQueries).usedPromiseByInteger._M_t._M_impl.super__Rb_tree_header;
  (this->activeQueries).usedPromiseByInteger._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->activeQueries).usedPromiseByInteger._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  (this->activeQueries).promiseLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->activeQueries).promiseLock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->activeQueries).promiseLock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->activeQueries).promiseLock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->activeQueries).promiseByString._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->activeQueries).promiseLock.super___mutex_base._M_mutex.__align = 0;
  (this->activeQueries).usedPromiseByInteger._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->activeQueries).usedPromiseByInteger._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->activeQueries).usedPromiseByInteger._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->activeQueries).usedPromiseByString._M_t._M_impl.super__Rb_tree_header;
  (this->activeQueries).usedPromiseByString._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->activeQueries).usedPromiseByString._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->activeQueries).usedPromiseByString._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->activeQueries).usedPromiseByString._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->activeQueries).usedPromiseByString._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->queryTimeouts).
  super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->queryTimeouts).
  super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->queryTimeouts).
  super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->queryTimeouts).
  super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->queryTimeouts).
  super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->queryTimeouts).
  super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->queryTimeouts).
  super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->queryTimeouts).
  super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->queryTimeouts).
  super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->queryTimeouts).
  super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ::_M_initialize_map(&(this->queryTimeouts).
                       super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                      ,0);
  (this->mapBuilders).
  super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->filterFed = (FilterFederate *)0x0;
  (this->mapBuilders).
  super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mapBuilders).
  super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filterThread)._M_i._M_thread = 0;
  (this->filterFedID)._M_i.gid = -2010000000;
  (this->nextAirLock).super___atomic_base<unsigned_short>._M_i = 0;
  this_00 = &(this->dataAirlocks)._M_elems[0].condition;
  lVar3 = 0x1c0;
  do {
    this_00[-0x40] = (condition_variable)0x0;
    *(undefined8 *)(this_00 + -0x38) = 0;
    *(undefined8 *)(this_00 + -0x30) = 0;
    *(undefined8 *)(this_00 + -0x28) = 0;
    *(undefined8 *)(this_00 + -0x20) = 0;
    *(undefined8 *)(this_00 + -0x18) = 0;
    *(undefined8 *)(this_00 + -0x10) = 0;
    *(undefined8 *)(this_00 + -8) = 0;
    std::condition_variable::condition_variable(this_00);
    this_00 = this_00 + 0x70;
    lVar3 = lVar3 + -0x70;
  } while (lVar3 != 0);
  (this->disconnection).triggered._M_base._M_i = false;
  (this->disconnection).activeLock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->disconnection).activeLock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->disconnection).activeLock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->disconnection).activeLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->disconnection).activeLock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->disconnection).triggerLock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->disconnection).triggerLock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->disconnection).triggerLock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->disconnection).triggerLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)
   ((long)&(this->disconnection).triggerLock.super___mutex_base._M_mutex.__data.__list.__prev + 1) =
       0;
  *(undefined8 *)
   ((long)&(this->disconnection).triggerLock.super___mutex_base._M_mutex.__data.__list.__next + 1) =
       0;
  std::condition_variable::condition_variable(&(this->disconnection).cv_trigger);
  std::condition_variable::condition_variable(&(this->disconnection).cv_active);
  (this->initIterations)._M_base._M_i = false;
  return;
}

Assistant:

CommonCore::CommonCore() noexcept: timeoutMon(std::make_unique<TimeoutMonitor>()) {}